

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EllipsoidRecord2::Encode(EllipsoidRecord2 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EllipsoidRecord2 *this_local;
  
  pKVar1 = KDataStream::operator<<
                     (stream,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp)
  ;
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui16Length);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui8Index);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<
                     (pKVar1,&(this->super_EllipsoidRecord1).m_CentLocation.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->super_EllipsoidRecord1).m_Sigma.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DDT).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->super_EllipsoidRecord1).m_Ori.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void EllipsoidRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << KDIS_STREAM m_Sigma
           << KDIS_STREAM m_DDT
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_ui32Padding; // padding to 64 bit boundary.
}